

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O3

void Ssc_ManCnfAddToFrontier(Ssc_Man_t *p,int Id,Vec_Int_t *vFront)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  
  if (Id < 1) {
    __assert_fail("Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,199,"void Ssc_ManCnfAddToFrontier(Ssc_Man_t *, int, Vec_Int_t *)");
  }
  if (p->vId2Var->nSize <= Id) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = p->vId2Var->pArray;
  if (piVar3[(uint)Id] == 0) {
    if (p->pFraig->nObjs <= Id) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar4 = p->pFraig->pObjs;
    iVar1 = p->nSatVars;
    p->nSatVars = iVar1 + 1;
    piVar3[(uint)Id] = iVar1;
    if (((long)iVar1 < 0) || (p->vVar2Id->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p->vVar2Id->pArray[iVar1] = Id;
    sat_solver_setnvars(p->pSat,p->nSatVars + 100);
    uVar2 = *(uint *)(pGVar4 + (uint)Id);
    if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
      Vec_IntPush(vFront,Id);
      return;
    }
  }
  return;
}

Assistant:

static void Ssc_ManCnfAddToFrontier( Ssc_Man_t * p, int Id, Vec_Int_t * vFront )
{
    Gia_Obj_t * pObj;
    assert( Id > 0 );
    if ( Ssc_ObjSatVar(p, Id) )
        return;
    pObj = Gia_ManObj( p->pFraig, Id );
    Ssc_ObjSetSatVar( p, Id, p->nSatVars++ );
    sat_solver_setnvars( p->pSat, p->nSatVars + 100 );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_IntPush( vFront, Id );
}